

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O3

void __thiscall QListWidgetItem::~QListWidgetItem(QListWidgetItem *this)

{
  ~QListWidgetItem(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

QListWidgetItem::~QListWidgetItem()
{
    if (QListModel *model = listModel())
        model->remove(this);
    delete d;
}